

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O2

void __thiscall
flatbuffers::vector_downward<unsigned_int>::fill
          (vector_downward<unsigned_int> *this,size_t zero_pad_bytes)

{
  size_t i;
  size_t sVar1;
  
  make_space(this,zero_pad_bytes);
  for (sVar1 = 0; zero_pad_bytes != sVar1; sVar1 = sVar1 + 1) {
    this->cur_[sVar1] = '\0';
  }
  return;
}

Assistant:

void fill(size_t zero_pad_bytes) {
    make_space(zero_pad_bytes);
    for (size_t i = 0; i < zero_pad_bytes; i++) cur_[i] = 0;
  }